

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Function_BlockSpecializationsEntry_DoNotUse *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse>
          (Arena *arena)

{
  Function_BlockSpecializationsEntry_DoNotUse *pFVar1;
  
  if (arena != (Arena *)0x0) {
    pFVar1 = DoCreateMessage<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse>
                       (arena);
    return pFVar1;
  }
  pFVar1 = (Function_BlockSpecializationsEntry_DoNotUse *)operator_new(0x28);
  CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse::
  Function_BlockSpecializationsEntry_DoNotUse(pFVar1,(Arena *)0x0);
  return pFVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }